

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sx_strpool * sx_strpool_create(sx_alloc *alloc,sx_strpool_config *conf)

{
  code *pcVar1;
  strpool_t *pool;
  sx_strpool *psVar2;
  strpool_t *sp;
  strpool_config_t sconf;
  sx_strpool_config *conf_local;
  sx_alloc *alloc_local;
  
  if (conf == (sx_strpool_config *)0x0) {
    sconf.memctx._0_4_ = 0;
    sconf.memctx._4_4_ = 0xc;
    sconf.ignore_case = 0x14;
    sconf.counter_bits = 0x1000;
    sconf.index_bits = 0x20;
    sconf.entry_capacity = 0x40000;
    sconf.block_capacity = 0x17;
  }
  else {
    sconf.memctx._0_4_ = conf->ignore_case;
    sconf.memctx._4_4_ = conf->counter_bits;
    sconf.ignore_case = conf->index_bits;
    sconf.counter_bits = conf->entry_capacity;
    sconf.index_bits = conf->block_capacity;
    sconf.entry_capacity = conf->block_sz_kb << 10;
    sconf.block_capacity = conf->min_str_len;
  }
  sp = (strpool_t *)alloc;
  sconf._32_8_ = conf;
  pool = (strpool_t *)sx__malloc(alloc,0x80,0,(char *)0x0,(char *)0x0,0);
  if (pool == (strpool_t *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",0x2ff);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x2ff,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_strpool *)(*pcVar1)();
    return psVar2;
  }
  strpool_init(pool,(strpool_config_t *)&sp);
  return pool;
}

Assistant:

sx_strpool* sx_strpool_create(const sx_alloc* alloc, const sx_strpool_config* conf)
{
    strpool_config_t sconf;
    sconf.memctx = (void*)alloc;
    if (!conf) {
        sconf.ignore_case = 0;
        sconf.counter_bits = 12;
        sconf.index_bits = 20;
        sconf.entry_capacity = 4096;
        sconf.block_capacity = 32;
        sconf.block_size = 256 * 1024;
        sconf.min_length = 23;
    } else {
        sconf.ignore_case = conf->ignore_case;
        sconf.counter_bits = conf->counter_bits;
        sconf.index_bits = conf->index_bits;
        sconf.entry_capacity = conf->entry_capacity;
        sconf.block_capacity = conf->block_capacity;
        sconf.block_size = conf->block_sz_kb * 1024;
        sconf.min_length = conf->min_str_len;
    }

    strpool_t* sp = (strpool_t*)sx_malloc(alloc, sizeof(strpool_t));
    if (!sp) {
        sx_out_of_memory();
        return NULL;
    }
    strpool_init(sp, &sconf);
    return sp;
}